

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::SetProperty_Internal<true>
               (Var receiver,RecyclableObject *object,bool isRoot,PropertyId propertyId,Var newValue
               ,PropertyValueInfo *info,ScriptContext *requestContext,
               PropertyOperationFlags propertyOperationFlags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Type *typeWithoutProperty_00;
  undefined4 *puVar4;
  RecyclableObject *object_00;
  RecyclableObject *pRStack_98;
  bool updateCache;
  RecyclableObject *instanceObject;
  RootObjectBase *rootObject;
  BOOL didSetProperty;
  Type *typeWithoutProperty;
  PropertyValueInfo *pPStack_70;
  BOOL setAccessorResult;
  PropertyValueInfo *info_local;
  Var newValue_local;
  PropertyId propertyId_local;
  bool isRoot_local;
  RecyclableObject *object_local;
  Var receiver_local;
  RecyclableObject *local_40;
  TypeId local_34;
  RecyclableObject *local_30;
  TypeId local_28;
  TypeId local_24;
  RecyclableObject *pRStack_20;
  TypeId typeId;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId_1;
  
  if (receiver == (Var)0x0) {
    receiver_local._4_4_ = 0;
  }
  else {
    pPStack_70 = info;
    info_local = (PropertyValueInfo *)newValue;
    newValue_local._0_4_ = propertyId;
    newValue_local._7_1_ = isRoot;
    _propertyId_local = object;
    object_local = (RecyclableObject *)receiver;
    bVar2 = TaggedNumber::Is(receiver);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xae1,"(!TaggedNumber::Is(receiver))",
                                  "!TaggedNumber::Is(receiver)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    typeWithoutProperty._4_4_ = 0;
    bVar2 = SetAccessorOrNonWritableProperty
                      (object_local,_propertyId_local,(uint)newValue_local,info_local,pPStack_70,
                       requestContext,propertyOperationFlags,(bool)(newValue_local._7_1_ & 1),false,
                       (BOOL *)((long)&typeWithoutProperty + 4));
    if (bVar2) {
      receiver_local._4_4_ = typeWithoutProperty._4_4_;
    }
    else {
      BVar3 = IsObject(object_local);
      if (BVar3 == 0) {
        JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,requestContext);
        receiver_local._4_4_ = 0;
      }
      else {
        typeWithoutProperty_00 = RecyclableObject::GetType(_propertyId_local);
        rootObject._4_4_ = 0;
        if ((newValue_local._7_1_ & 1) == 0) {
          pRStack_98 = VarTo<Js::RecyclableObject>(object_local);
          while (((BVar3 = IsNull(pRStack_98), BVar3 == 0 &&
                  (BVar3 = IsPropertyUnscopable(pRStack_98,(uint)newValue_local), BVar3 == 0)) &&
                 (rootObject._4_4_ =
                       (*(pRStack_98->super_FinalizableObject).super_IRecyclerVisitedObject.
                         _vptr_IRecyclerVisitedObject[0x17])
                                 (pRStack_98,(ulong)(uint)newValue_local,info_local,
                                  (ulong)propertyOperationFlags,pPStack_70), rootObject._4_4_ == 0))
                ) {
            pRStack_98 = GetPrototypeNoTrap(pRStack_98);
          }
        }
        else {
          local_30 = object_local;
          if (object_local == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar4 = 0;
          }
          bVar2 = TaggedInt::Is(local_30);
          if (bVar2) {
            local_28 = TypeIds_FirstNumberType;
          }
          else {
            bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_30);
            if (bVar2) {
              local_28 = TypeIds_Number;
            }
            else {
              pRStack_20 = UnsafeVarTo<Js::RecyclableObject>(local_30);
              if (pRStack_20 == (RecyclableObject *)0x0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar4 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar4 = 0;
              }
              local_24 = RecyclableObject::GetTypeId(pRStack_20);
              if ((0x57 < (int)local_24) &&
                 (BVar3 = RecyclableObject::IsExternal(pRStack_20), BVar3 == 0)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar4 = 1;
                bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar4 = 0;
              }
              local_28 = local_24;
            }
          }
          if (local_28 != TypeIds_GlobalObject) {
            local_40 = object_local;
            if (object_local == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
            bVar2 = TaggedInt::Is(local_40);
            if (bVar2) {
              local_34 = TypeIds_FirstNumberType;
            }
            else {
              bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(local_40);
              if (bVar2) {
                local_34 = TypeIds_Number;
              }
              else {
                pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(local_40);
                if (pRStack_10 == (RecyclableObject *)0x0) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar4 = 1;
                  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar4 = 0;
                }
                local_14 = RecyclableObject::GetTypeId(pRStack_10);
                if ((0x57 < (int)local_14) &&
                   (BVar3 = RecyclableObject::IsExternal(pRStack_10), BVar3 == 0)) {
                  AssertCount = AssertCount + 1;
                  Throw::LogAssert();
                  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar4 = 1;
                  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                              ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                              "GetTypeId aValue has invalid TypeId");
                  if (!bVar2) {
                    pcVar1 = (code *)invalidInstructionException();
                    (*pcVar1)();
                  }
                  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                  *puVar4 = 0;
                }
                local_34 = local_14;
              }
            }
            if (local_34 != TypeIds_LastTrueJavascriptObjectType) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 1;
              bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                          ,0xafa,
                                          "(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot)"
                                          ,"Root must be a global object!");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar4 = 0;
            }
          }
          rootObject._4_4_ =
               (*(object_local->super_FinalizableObject).super_IRecyclerVisitedObject.
                 _vptr_IRecyclerVisitedObject[0x6e])
                         (object_local,(ulong)(uint)newValue_local,info_local,
                          (ulong)propertyOperationFlags,pPStack_70);
        }
        if (rootObject._4_4_ == 0) {
          receiver_local._4_4_ = 0;
        }
        else {
          bVar2 = VarIs<Js::JavascriptProxy>(object_local);
          if (!bVar2) {
            object_00 = VarTo<Js::RecyclableObject>(object_local);
            CacheOperators::CachePropertyWrite
                      (object_00,(bool)(newValue_local._7_1_ & 1),typeWithoutProperty_00,
                       (uint)newValue_local,pPStack_70,requestContext);
          }
          receiver_local._4_4_ = 1;
        }
      }
    }
  }
  return receiver_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::SetProperty_Internal(Var receiver, RecyclableObject* object, const bool isRoot, PropertyId propertyId, Var newValue, PropertyValueInfo * info, ScriptContext* requestContext, PropertyOperationFlags propertyOperationFlags)
    {
        if (receiver == nullptr)
        {
            return FALSE;
        }

        Assert(!TaggedNumber::Is(receiver));
        BOOL setAccessorResult = FALSE;
        if (SetAccessorOrNonWritableProperty(receiver, object, propertyId, newValue, info, requestContext, propertyOperationFlags, isRoot, false, &setAccessorResult))
        {
            return setAccessorResult;
        }
        else if (!JavascriptOperators::IsObject(receiver))
        {
            JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, requestContext);
            return FALSE;
        }

#ifdef ENABLE_MUTATION_BREAKPOINT
        // Break on mutation if needed
        bool doNotUpdateCacheForMbp = MutationBreakpoint::IsFeatureEnabled(requestContext) ?
            MutationBreakpoint::HandleSetProperty(requestContext, object, propertyId, newValue) : false;
#endif

        // Get the original type before setting the property
        Type *typeWithoutProperty = object->GetType();
        BOOL didSetProperty = false;
        if (isRoot)
        {
            AssertMsg(JavascriptOperators::GetTypeId(receiver) == TypeIds_GlobalObject
                || JavascriptOperators::GetTypeId(receiver) == TypeIds_ModuleRoot,
                "Root must be a global object!");

            RootObjectBase* rootObject = static_cast<RootObjectBase*>(receiver);
            didSetProperty = rootObject->SetRootProperty(propertyId, newValue, propertyOperationFlags, info);
        }
        else
        {
            RecyclableObject* instanceObject = VarTo<RecyclableObject>(receiver);
            while (!JavascriptOperators::IsNull(instanceObject))
            {
                if (unscopables && JavascriptOperators::IsPropertyUnscopable(instanceObject, propertyId))
                {
                    break;
                }
                else
                {
                    didSetProperty = instanceObject->SetProperty(propertyId, newValue, propertyOperationFlags, info);
                    if (didSetProperty || !unscopables)
                    {
                        break;
                    }
                }
                instanceObject = JavascriptOperators::GetPrototypeNoTrap(instanceObject);
            }
        }

        if (didSetProperty)
        {
            bool updateCache = true;
#ifdef ENABLE_MUTATION_BREAKPOINT
            updateCache = updateCache && !doNotUpdateCacheForMbp;
#endif

            if (updateCache)
            {
                if (!VarIs<JavascriptProxy>(receiver))
                {
                    CacheOperators::CachePropertyWrite(VarTo<RecyclableObject>(receiver), isRoot, typeWithoutProperty, propertyId, info, requestContext);
                }
            }
            return TRUE;
        }

        return FALSE;
    }